

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

void __thiscall
capnp::TwoPartyVatNetwork::IncomingMessageImpl::IncomingMessageImpl
          (IncomingMessageImpl *this,MessageReaderAndFds *init,Array<kj::OwnFd> *fdSpace)

{
  size_t sVar1;
  bool bVar2;
  Own<capnp::MessageReader,_std::nullptr_t> *other;
  Array<kj::OwnFd> *other_00;
  Fault local_78;
  Fault f;
  OwnFd *local_58;
  OwnFd *local_50;
  undefined1 local_48 [8];
  DebugComparison<kj::OwnFd_*,_kj::OwnFd_*> _kjCondition;
  Array<kj::OwnFd> *fdSpace_local;
  MessageReaderAndFds *init_local;
  IncomingMessageImpl *this_local;
  
  _kjCondition._32_8_ = fdSpace;
  IncomingRpcMessage::IncomingRpcMessage(&this->super_IncomingRpcMessage);
  (this->super_IncomingRpcMessage)._vptr_IncomingRpcMessage = (_func_int **)&PTR_getBody_00d8f2f8;
  other = kj::mv<kj::Own<capnp::MessageReader,decltype(nullptr)>>(&init->reader);
  kj::Own<capnp::MessageReader,_std::nullptr_t>::Own(&this->message,other);
  other_00 = kj::mv<kj::Array<kj::OwnFd>>(fdSpace);
  kj::Array<kj::OwnFd>::Array(&this->fdSpace,other_00);
  sVar1 = (init->fds).size_;
  (this->fds).ptr = (init->fds).ptr;
  (this->fds).size_ = sVar1;
  local_58 = kj::ArrayPtr<kj::OwnFd>::begin(&this->fds);
  local_50 = (OwnFd *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
  f.exception = (Exception *)kj::Array<kj::OwnFd>::begin(&this->fdSpace);
  kj::_::DebugExpression<kj::OwnFd*>::operator==
            ((DebugComparison<kj::OwnFd_*,_kj::OwnFd_*> *)local_48,
             (DebugExpression<kj::OwnFd*> *)&local_50,(OwnFd **)&f);
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<kj::OwnFd*,kj::OwnFd*>&>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty.c++"
               ,0xec,FAILED,"this->fds.begin() == this->fdSpace.begin()","_kjCondition,",
               (DebugComparison<kj::OwnFd_*,_kj::OwnFd_*> *)local_48);
    kj::_::Debug::Fault::fatal(&local_78);
  }
  return;
}

Assistant:

IncomingMessageImpl(MessageReaderAndFds init, kj::Array<kj::OwnFd> fdSpace)
      : message(kj::mv(init.reader)),
        fdSpace(kj::mv(fdSpace)),
        fds(init.fds) {
    KJ_DASSERT(this->fds.begin() == this->fdSpace.begin());
  }